

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::doItemsLayout(QTreeView *this)

{
  QSet<QPersistentModelIndex> *pQVar1;
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  char cVar4;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar5;
  Data *pDVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  piter it;
  piter it_00;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (this_00->hasRemovedItems != true) goto LAB_005b038a;
  this_00->hasRemovedItems = false;
  pQVar1 = &this_00->expandedIndexes;
  pDVar5 = (this_00->expandedIndexes).q_hash.d;
  if (pDVar5 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
    pDVar6 = (Data *)0x0;
LAB_005b01d0:
    sVar7 = 0;
  }
  else {
    if (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
               detached(pDVar5);
      (pQVar1->q_hash).d = pDVar5;
    }
    pDVar6 = (pQVar1->q_hash).d;
    if (pDVar6->spans->offsets[0] != 0xff) goto LAB_005b01d0;
    uVar3 = 1;
    do {
      sVar7 = uVar3;
      if (pDVar6->numBuckets == sVar7) {
        pDVar6 = (Data *)0x0;
        sVar7 = 0;
        break;
      }
      uVar3 = sVar7 + 1;
    } while (pDVar6->spans[sVar7 >> 7].offsets[(uint)sVar7 & 0x7f] == 0xff);
  }
  it.bucket = sVar7;
  it.d = pDVar6;
  if (pDVar6 != (Data *)0x0 || sVar7 != 0) {
    do {
      sVar7 = it.bucket;
      pDVar5 = it.d;
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 == '\0') {
        it = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                              (&pQVar1->q_hash,(const_iterator)it);
      }
      else {
        do {
          if (pDVar5->numBuckets - 1 == sVar7) {
            it = (piter)ZEXT816(0);
            break;
          }
          sVar7 = sVar7 + 1;
          it.bucket = sVar7;
          it.d = pDVar5;
        } while (pDVar5->spans[sVar7 >> 7].offsets[(uint)sVar7 & 0x7f] == 0xff);
      }
    } while ((it.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
            (it.bucket != 0));
  }
  pQVar1 = &this_00->hiddenIndexes;
  pDVar5 = (this_00->hiddenIndexes).q_hash.d;
  if (pDVar5 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
    pDVar6 = (Data *)0x0;
LAB_005b02e5:
    sVar7 = 0;
  }
  else {
    if (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
               detached(pDVar5);
      (pQVar1->q_hash).d = pDVar5;
    }
    pDVar6 = (pQVar1->q_hash).d;
    if (pDVar6->spans->offsets[0] != 0xff) goto LAB_005b02e5;
    uVar3 = 1;
    do {
      sVar7 = uVar3;
      if (pDVar6->numBuckets == sVar7) {
        pDVar6 = (Data *)0x0;
        sVar7 = 0;
        break;
      }
      uVar3 = sVar7 + 1;
    } while (pDVar6->spans[sVar7 >> 7].offsets[(uint)sVar7 & 0x7f] == 0xff);
  }
  it_00.bucket = sVar7;
  it_00.d = pDVar6;
  if (pDVar6 != (Data *)0x0 || sVar7 != 0) {
    do {
      sVar7 = it_00.bucket;
      pDVar5 = it_00.d;
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 == '\0') {
        it_00 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                                 (&pQVar1->q_hash,(const_iterator)it_00);
      }
      else {
        do {
          if (pDVar5->numBuckets - 1 == sVar7) {
            it_00 = (piter)ZEXT816(0);
            break;
          }
          sVar7 = sVar7 + 1;
          it_00.bucket = sVar7;
          it_00.d = pDVar5;
        } while (pDVar5->spans[sVar7 >> 7].offsets[(uint)sVar7 & 0x7f] == 0xff);
      }
    } while ((it_00.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
            || (it_00.bucket != 0));
  }
LAB_005b038a:
  QList<QTreeViewItem>::clear(&this_00->viewItems);
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            (&local_48,&(this_00->super_QAbstractItemViewPrivate).root);
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  cVar4 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,&local_48);
  if (cVar4 != '\0') {
    QTreeViewPrivate::layout(this_00,-1,false,false);
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)this);
  (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x220))();
  QTreeViewPrivate::updateAccessibility(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::doItemsLayout()
{
    Q_D(QTreeView);
    if (d->hasRemovedItems) {
        //clean the QSet that may contains old (and this invalid) indexes
        d->hasRemovedItems = false;
        QSet<QPersistentModelIndex>::iterator it = d->expandedIndexes.begin();
        while (it != d->expandedIndexes.end()) {
            if (!it->isValid())
                it = d->expandedIndexes.erase(it);
            else
                ++it;
        }
        it = d->hiddenIndexes.begin();
        while (it != d->hiddenIndexes.end()) {
            if (!it->isValid())
                it = d->hiddenIndexes.erase(it);
            else
                ++it;
        }
    }
    d->viewItems.clear(); // prepare for new layout
    QModelIndex parent = d->root;
    if (d->model->hasChildren(parent)) {
        d->layout(-1);
    }
    QAbstractItemView::doItemsLayout();
    d->header->doItemsLayout();
    d->updateAccessibility();
}